

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 挑7.cpp
# Opt level: O1

int main(void)

{
  uint uVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  uint __len;
  int iVar5;
  int iVar6;
  uint __val;
  ulong uVar7;
  int n;
  string __str;
  int local_54;
  char *local_50 [2];
  char local_40 [16];
  
  plVar3 = (long *)std::istream::operator>>((istream *)&std::cin,&local_54);
  if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
    do {
      iVar5 = 0;
      if (5 < local_54) {
        iVar5 = 0;
        uVar7 = 6;
        do {
          __val = (uint)uVar7;
          iVar6 = (int)(uVar7 * 0x24924925 >> 0x20);
          __len = 1;
          iVar6 = ((__val - iVar6 >> 1) + iVar6 >> 2) * -7 + __val;
          if (iVar6 != 0) {
            if (9 < __val) {
              uVar1 = 4;
              do {
                __len = uVar1;
                uVar2 = (uint)uVar7;
                if (uVar2 < 100) {
                  __len = __len - 2;
                  goto LAB_001012ca;
                }
                if (uVar2 < 1000) {
                  __len = __len - 1;
                  goto LAB_001012ca;
                }
                if (uVar2 < 10000) goto LAB_001012ca;
                uVar7 = uVar7 / 10000;
                uVar1 = __len + 4;
              } while (99999 < uVar2);
              __len = __len + 1;
            }
LAB_001012ca:
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct((ulong)local_50,(char)__len);
            std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0],__len,__val);
            lVar4 = std::__cxx11::string::find((char)local_50,0x37);
            __len = (uint)(lVar4 != -1);
          }
          if ((iVar6 != 0) && (local_50[0] != local_40)) {
            operator_delete(local_50[0]);
          }
          iVar5 = iVar5 + __len;
          uVar7 = (ulong)(__val + 1);
        } while ((int)__val < local_54);
      }
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      plVar3 = (long *)std::istream::operator>>((istream *)&std::cin,&local_54);
    } while ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0);
  }
  return 0;
}

Assistant:

int main()
{
    int n;
    while(cin>>n)
    {
        int sum(0);
        for (int i=6;i<n+1;i++)
        {
            if(i%7 == 0 || to_string(i).find('7') != -1)
                sum++;
        }

        cout<<sum<<endl;
        //cout<<stoi("23454")<<endl;
        //stox,以及to_string两个函数都是std中的成员，不需要其他头文件引用
    }
    return 0;
}